

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

ImGuiColumns * ImGui::FindOrCreateColumns(ImGuiWindow *window,ImGuiID id)

{
  ImGuiColumns *pIVar1;
  ImVector<ImGuiColumns> *this;
  ImGuiID in_ESI;
  long in_RDI;
  ImGuiColumns *columns;
  int n;
  ImGuiColumns *in_stack_ffffffffffffff58;
  ImGuiColumns *in_stack_ffffffffffffff70;
  int local_18;
  
  local_18 = 0;
  while( true ) {
    if (*(int *)(in_RDI + 0x2d8) <= local_18) {
      this = (ImVector<ImGuiColumns> *)(in_RDI + 0x2d8);
      ImGuiColumns::ImGuiColumns(in_stack_ffffffffffffff70);
      ImVector<ImGuiColumns>::push_back(this,in_stack_ffffffffffffff58);
      ImGuiColumns::~ImGuiColumns((ImGuiColumns *)0x221e08);
      pIVar1 = ImVector<ImGuiColumns>::back((ImVector<ImGuiColumns> *)(in_RDI + 0x2d8));
      pIVar1->ID = in_ESI;
      return pIVar1;
    }
    pIVar1 = ImVector<ImGuiColumns>::operator[]((ImVector<ImGuiColumns> *)(in_RDI + 0x2d8),local_18)
    ;
    if (pIVar1->ID == in_ESI) break;
    local_18 = local_18 + 1;
  }
  pIVar1 = ImVector<ImGuiColumns>::operator[]((ImVector<ImGuiColumns> *)(in_RDI + 0x2d8),local_18);
  return pIVar1;
}

Assistant:

ImGuiColumns* ImGui::FindOrCreateColumns(ImGuiWindow* window, ImGuiID id)
{
    // We have few columns per window so for now we don't need bother much with turning this into a faster lookup.
    for (int n = 0; n < window->ColumnsStorage.Size; n++)
        if (window->ColumnsStorage[n].ID == id)
            return &window->ColumnsStorage[n];

    window->ColumnsStorage.push_back(ImGuiColumns());
    ImGuiColumns* columns = &window->ColumnsStorage.back();
    columns->ID = id;
    return columns;
}